

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_shooting_cgmres.cpp
# Opt level: O3

void __thiscall
MultipleShootingCGMRES::initSolution
          (MultipleShootingCGMRES *this,double initial_time,VectorXd *initial_state_vec,
          VectorXd *initial_guess_input_vec,double convergence_radius,int max_iteration)

{
  double *pdVar1;
  undefined8 *puVar2;
  _func_int **pp_Var3;
  double dVar4;
  undefined8 uVar5;
  _func_int *p_Var6;
  int iVar7;
  void *pvVar8;
  undefined8 *puVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  char *pcVar13;
  double *pdVar14;
  SrcEvaluatorType srcEvaluator;
  uint uVar15;
  Index index;
  double *pdVar16;
  ulong uVar17;
  ulong uVar18;
  Index index_1;
  double *pdVar19;
  long lVar20;
  ulong uVar21;
  SrcEvaluatorType srcEvaluator_1;
  ActualDstType actualDst_1;
  Index outer_stride;
  double *pdVar22;
  ulong uVar23;
  VectorXd initial_control_input_and_constraints_vec;
  double *__tmp;
  InitCGMRES initializer;
  assign_op<double,_double> local_1c9;
  void *local_1c8;
  double *pdStack_1c0;
  void *local_1b8;
  double local_1b0;
  undefined1 local_1a8 [16];
  scalar_constant_op<double> local_198;
  double local_190;
  void *local_188;
  double *local_180;
  InitCGMRES local_170;
  void *local_48;
  ulong local_40;
  
  local_1c8 = (void *)0x0;
  pdStack_1c0 = (double *)0x0;
  iVar7 = this->dim_control_input_and_constraints_;
  pdVar22 = (double *)(long)iVar7;
  local_190 = convergence_radius;
  if (-1 < (long)pdVar22) {
    local_1b0 = initial_time;
    if (iVar7 == 0) {
      pvVar8 = (void *)0x0;
      pdStack_1c0 = pdVar22;
    }
    else {
      pvVar8 = malloc((long)pdVar22 * 8);
      if (iVar7 != 1 && ((ulong)pvVar8 & 0xf) != 0) goto LAB_0010d7aa;
      if (pvVar8 == (void *)0x0) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar9 = std::ios::widen;
        __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      local_1c8 = pvVar8;
      pdStack_1c0 = pdVar22;
      pvVar8 = malloc((long)pdVar22 * 8);
      if (iVar7 != 1 && ((ulong)pvVar8 & 0xf) != 0) goto LAB_0010d7aa;
      if (pvVar8 == (void *)0x0) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar9 = std::ios::widen;
        __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
    iVar7 = this->dim_state_;
    uVar23 = (ulong)iVar7;
    if (-1 < (long)uVar23) {
      local_1b8 = pvVar8;
      if (iVar7 == 0) {
        pvVar8 = (void *)0x0;
      }
      else {
        pvVar8 = malloc(uVar23 * 8);
        if (iVar7 != 1 && ((ulong)pvVar8 & 0xf) != 0) {
LAB_0010d7aa:
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                        "void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        if (pvVar8 == (void *)0x0) {
          puVar9 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar9 = std::ios::widen;
          __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
      }
      InitCGMRES::InitCGMRES(&local_170,this->model_,this->difference_increment_,this->dim_krylov_);
      this->initial_time_ = local_1b0;
      local_188 = local_1c8;
      local_180 = pdStack_1c0;
      if (-1 < (long)pdStack_1c0 || local_1c8 == (void *)0x0) {
        InitCGMRES::solve0stepNOCP
                  (&local_170,local_1b0,initial_state_vec,initial_guess_input_vec,local_190,
                   max_iteration,
                   (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                   &local_188);
        local_48 = pvVar8;
        local_40 = uVar23;
        NMPCModel::phixFunc(&this->model_,local_1b0,initial_state_vec,
                            (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>
                             *)&local_48);
        if (0 < this->horizon_division_num_) {
          lVar10 = 0;
          lVar12 = 0;
          do {
            uVar11 = this->dim_control_input_and_constraints_;
            pdVar14 = (double *)(long)(int)uVar11;
            pdVar22 = (this->control_input_and_constraints_seq_).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data;
            if (pdVar22 != (double *)0x0 && (long)pdVar14 < 0) goto LAB_0010d6f8;
            iVar7 = (int)lVar12;
            uVar15 = uVar11 * iVar7;
            if (((int)(uVar15 | uVar11) < 0) ||
               ((this->control_input_and_constraints_seq_).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
                (long)pdVar14 < (long)(int)uVar15)) goto LAB_0010d6d9;
            if (pdStack_1c0 != pdVar14) goto LAB_0010d6c2;
            pdVar16 = pdVar14;
            if ((((ulong)(pdVar22 + (int)uVar15) & 7) == 0) &&
               (pdVar16 = (double *)(ulong)((uint)((ulong)(pdVar22 + (int)uVar15) >> 3) & 1),
               (long)pdVar14 <= (long)pdVar16)) {
              pdVar16 = pdVar14;
            }
            if (0 < (long)pdVar16) {
              pdVar19 = (double *)0x0;
              do {
                pdVar22[(long)(int)(uVar11 * iVar7) + (long)pdVar19] =
                     *(double *)((long)local_1c8 + (long)pdVar19 * 8);
                pdVar19 = (double *)((long)pdVar19 + 1);
              } while (pdVar16 != pdVar19);
            }
            lVar20 = (long)pdVar14 - (long)pdVar16;
            pdVar19 = (double *)((lVar20 - (lVar20 >> 0x3f) & 0xfffffffffffffffeU) + (long)pdVar16);
            if (1 < lVar20) {
              do {
                pdVar1 = (double *)((long)local_1c8 + (long)pdVar16 * 8);
                dVar4 = pdVar1[1];
                pdVar22[(long)(int)(uVar11 * iVar7) + (long)pdVar16] = *pdVar1;
                (pdVar22 + (long)(int)(uVar11 * iVar7) + (long)pdVar16)[1] = dVar4;
                pdVar16 = (double *)((long)pdVar16 + 2);
              } while ((long)pdVar16 < (long)pdVar19);
            }
            if ((long)pdVar19 < (long)pdVar14) {
              do {
                pdVar22[(long)(int)(uVar11 * iVar7) + (long)pdVar19] =
                     *(double *)((long)local_1c8 + (long)pdVar19 * 8);
                pdVar19 = (double *)((long)pdVar19 + 1);
              } while (pdVar14 != pdVar19);
            }
            pdVar22 = (this->state_mat_).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data;
            uVar18 = (this->state_mat_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows;
            if ((long)uVar18 < 0 && pdVar22 != (double *)0x0) {
LAB_0010d74d:
              pcVar13 = 
              "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
              ;
              goto LAB_0010d762;
            }
            if ((this->state_mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols <= lVar12) {
LAB_0010d72e:
              __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                            ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                            "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                           );
            }
            if (uVar18 != (initial_state_vec->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                          m_rows) {
LAB_0010d70f:
              pcVar13 = 
              "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>]"
              ;
              goto LAB_0010d724;
            }
            uVar17 = uVar18;
            if ((((ulong)(pdVar22 + uVar18 * lVar12) & 7) == 0) &&
               (uVar17 = (ulong)((uint)((ulong)(pdVar22 + uVar18 * lVar12) >> 3) & 1),
               (long)uVar18 <= (long)uVar17)) {
              uVar17 = uVar18;
            }
            pdVar14 = (initial_state_vec->
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                      m_data;
            if (0 < (long)uVar17) {
              uVar21 = 0;
              do {
                *(double *)((long)pdVar22 + uVar21 * 8 + uVar18 * lVar10) = pdVar14[uVar21];
                uVar21 = uVar21 + 1;
              } while (uVar17 != uVar21);
            }
            lVar20 = uVar18 - uVar17;
            uVar21 = (lVar20 - (lVar20 >> 0x3f) & 0xfffffffffffffffeU) + uVar17;
            if (1 < lVar20) {
              do {
                dVar4 = (pdVar14 + uVar17)[1];
                pdVar16 = (double *)((long)pdVar22 + uVar17 * 8 + uVar18 * lVar10);
                *pdVar16 = pdVar14[uVar17];
                pdVar16[1] = dVar4;
                uVar17 = uVar17 + 2;
              } while ((long)uVar17 < (long)uVar21);
            }
            if ((long)uVar21 < (long)uVar18) {
              do {
                *(double *)((long)pdVar22 + uVar21 * 8 + uVar18 * lVar10) = pdVar14[uVar21];
                uVar21 = uVar21 + 1;
              } while (uVar18 != uVar21);
            }
            pdVar22 = (this->lambda_mat_).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data;
            uVar18 = (this->lambda_mat_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows;
            if ((long)uVar18 < 0 && pdVar22 != (double *)0x0) goto LAB_0010d74d;
            if ((this->lambda_mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                .m_storage.m_cols <= lVar12) goto LAB_0010d72e;
            if (uVar18 != uVar23) goto LAB_0010d70f;
            uVar17 = uVar23;
            if ((((ulong)(pdVar22 + uVar18 * lVar12) & 7) == 0) &&
               (uVar17 = (ulong)((uint)((ulong)(pdVar22 + uVar18 * lVar12) >> 3) & 1),
               (long)uVar23 <= (long)uVar17)) {
              uVar17 = uVar23;
            }
            if (0 < (long)uVar17) {
              uVar21 = 0;
              do {
                *(undefined8 *)((long)pdVar22 + uVar21 * 8 + uVar18 * lVar10) =
                     *(undefined8 *)((long)pvVar8 + uVar21 * 8);
                uVar21 = uVar21 + 1;
              } while (uVar17 != uVar21);
            }
            lVar20 = uVar23 - uVar17;
            uVar21 = (lVar20 - (lVar20 >> 0x3f) & 0xfffffffffffffffeU) + uVar17;
            if (1 < lVar20) {
              do {
                puVar9 = (undefined8 *)((long)pvVar8 + uVar17 * 8);
                uVar5 = puVar9[1];
                puVar2 = (undefined8 *)((long)pdVar22 + uVar17 * 8 + uVar18 * lVar10);
                *puVar2 = *puVar9;
                puVar2[1] = uVar5;
                uVar17 = uVar17 + 2;
              } while ((long)uVar17 < (long)uVar21);
            }
            if ((long)uVar21 < (long)uVar23) {
              do {
                *(undefined8 *)((long)pdVar22 + uVar21 * 8 + uVar18 * lVar10) =
                     *(undefined8 *)((long)pvVar8 + uVar21 * 8);
                uVar21 = uVar21 + 1;
              } while (uVar23 != uVar21);
            }
            lVar12 = lVar12 + 1;
            lVar10 = lVar10 + 8;
          } while (lVar12 < this->horizon_division_num_);
        }
        InitCGMRES::getOptimalityErrorVec
                  ((InitCGMRES *)local_1a8,local_1b0,(VectorXd *)&local_170,initial_state_vec);
        uVar5 = local_1a8._0_8_;
        free(local_1b8);
        uVar11 = this->horizon_division_num_;
        if (0 < (int)uVar11) {
          iVar7 = 0;
          do {
            uVar11 = this->dim_control_input_and_constraints_;
            uVar23 = (ulong)(int)uVar11;
            pdVar22 = (this->control_input_and_constraints_error_seq_).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data;
            if (pdVar22 != (double *)0x0 && (long)uVar23 < 0) goto LAB_0010d6f8;
            uVar15 = uVar11 * iVar7;
            if (((int)(uVar15 | uVar11) < 0) ||
               ((long)((this->control_input_and_constraints_error_seq_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows - uVar23) < (long)(int)uVar15)) {
LAB_0010d6d9:
              __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                            ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                            "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                           );
            }
            if (local_1a8._8_8_ != uVar23) {
LAB_0010d6c2:
              pcVar13 = 
              "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
              ;
LAB_0010d724:
              __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                            ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,pcVar13);
            }
            uVar23 = local_1a8._8_8_;
            if ((((ulong)(pdVar22 + (int)uVar15) & 7) == 0) &&
               (uVar23 = (ulong)((uint)((ulong)(pdVar22 + (int)uVar15) >> 3) & 1),
               (long)local_1a8._8_8_ <= (long)uVar23)) {
              uVar23 = local_1a8._8_8_;
            }
            if (0 < (long)uVar23) {
              uVar18 = 0;
              do {
                pdVar22[(long)(int)(uVar11 * iVar7) + uVar18] =
                     (double)*(_func_int **)(local_1a8._0_8_ + uVar18 * 8);
                uVar18 = uVar18 + 1;
              } while (uVar23 != uVar18);
            }
            lVar10 = local_1a8._8_8_ - uVar23;
            uVar18 = (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffeU) + uVar23;
            if (1 < lVar10) {
              do {
                pp_Var3 = (_func_int **)(local_1a8._0_8_ + uVar23 * 8);
                p_Var6 = pp_Var3[1];
                pdVar22[(long)(int)(uVar11 * iVar7) + uVar23] = (double)*pp_Var3;
                (pdVar22 + (long)(int)(uVar11 * iVar7) + uVar23)[1] = (double)p_Var6;
                uVar23 = uVar23 + 2;
              } while ((long)uVar23 < (long)uVar18);
            }
            if ((long)uVar18 < (long)local_1a8._8_8_) {
              do {
                pdVar22[(long)(int)(uVar11 * iVar7) + uVar18] =
                     (double)*(_func_int **)(local_1a8._0_8_ + uVar18 * 8);
                uVar18 = uVar18 + 1;
              } while (local_1a8._8_8_ != uVar18);
            }
            iVar7 = iVar7 + 1;
            uVar11 = this->horizon_division_num_;
          } while (iVar7 < (int)uVar11);
        }
        local_1a8._0_8_ = SEXT48(this->dim_state_);
        local_1a8._8_8_ = SEXT48((int)uVar11);
        local_198.m_other = 0.0;
        if (-1 < (int)(this->dim_state_ | uVar11)) {
          Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    (&this->state_error_mat_,
                     (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                      *)local_1a8,&local_1c9);
          local_1a8._0_8_ = SEXT48(this->dim_state_);
          local_1a8._8_8_ = SEXT48(this->horizon_division_num_);
          local_198.m_other = 0.0;
          if (-1 < (this->horizon_division_num_ | this->dim_state_)) {
            Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                      (&this->lambda_error_mat_,
                       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                        *)local_1a8,&local_1c9);
            free(local_170.error_vec_2_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
            free(local_170.error_vec_1_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
            free(local_170.error_vec_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                 .m_storage.m_data);
            free(local_170.lambda_vec_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
            free(local_170.incremented_solution_vec_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
            free(local_170.solution_update_vec_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
            local_170.super_MatrixFreeGMRES._vptr_MatrixFreeGMRES =
                 (_func_int **)&PTR___cxa_pure_virtual_00120bc8;
            free(local_170.super_MatrixFreeGMRES.g_vec_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
            free(local_170.super_MatrixFreeGMRES.givens_s_vec_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
            free(local_170.super_MatrixFreeGMRES.givens_c_vec_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
            free(local_170.super_MatrixFreeGMRES.b_vec_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
            free(local_170.super_MatrixFreeGMRES.basis_mat_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
            free(local_170.super_MatrixFreeGMRES.hessenberg_mat_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
            free(pvVar8);
            free((void *)uVar5);
            free(local_1c8);
            return;
          }
        }
        local_198.m_other = 0.0;
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      pcVar13 = 
      "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
      ;
      goto LAB_0010d762;
    }
  }
  __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
LAB_0010d6f8:
  pcVar13 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
  ;
LAB_0010d762:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar13);
}

Assistant:

void MultipleShootingCGMRES::initSolution(const double initial_time, const Eigen::VectorXd& initial_state_vec, const Eigen::VectorXd& initial_guess_input_vec, const double convergence_radius, const int max_iteration)
{
    Eigen::VectorXd initial_control_input_and_constraints_vec(dim_control_input_and_constraints_), initial_control_input_and_constraints_error(dim_control_input_and_constraints_), initial_lambda_vec(dim_state_);
    InitCGMRES initializer(model_, difference_increment_, dim_krylov_);
    initial_time_ = initial_time;

    // Intialize the solution
    initializer.solve0stepNOCP(initial_time, initial_state_vec, initial_guess_input_vec, convergence_radius, max_iteration, initial_control_input_and_constraints_vec);
    model_.phixFunc(initial_time, initial_state_vec, initial_lambda_vec);
    for(int i=0; i<horizon_division_num_; i++){
        control_input_and_constraints_seq_.segment(i*dim_control_input_and_constraints_, dim_control_input_and_constraints_) = initial_control_input_and_constraints_vec;
        state_mat_.col(i) = initial_state_vec;
        lambda_mat_.col(i) = initial_lambda_vec;
    }

    // Intialize the optimality error.
    initial_control_input_and_constraints_error = initializer.getOptimalityErrorVec(initial_time, initial_state_vec, initial_control_input_and_constraints_vec);
    for(int i=0; i<horizon_division_num_; i++){
        control_input_and_constraints_error_seq_.segment(i*dim_control_input_and_constraints_, dim_control_input_and_constraints_) = initial_control_input_and_constraints_error;
    }
    state_error_mat_ = Eigen::MatrixXd::Zero(dim_state_, horizon_division_num_);
    lambda_error_mat_ = Eigen::MatrixXd::Zero(dim_state_, horizon_division_num_);
}